

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O3

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,bool recurse,bool listDirectories,bool followSymlinks,
          string *relative,string *expression,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *variable,cmListFileBacktrace *backtrace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer ppVar4;
  bool bVar5;
  mapped_type *pmVar6;
  pointer ppVar7;
  CacheEntryKey key;
  ostringstream message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  cmGlobVerificationManager *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210;
  key_type local_1f0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar3 = (relative->_M_dataplus)._M_p;
  local_258 = &local_248;
  local_238 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,pcVar3 + relative->_M_string_length);
  pcVar3 = (expression->_M_dataplus)._M_p;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar3,pcVar3 + expression->_M_string_length);
  paVar1 = &local_1f0.Relative.field_2;
  if (local_258 == &local_248) {
    local_1f0.Relative.field_2._8_8_ = local_248._8_8_;
    local_1f0.Relative._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1f0.Relative._M_dataplus._M_p = (pointer)local_258;
  }
  local_1f0.Relative.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
  local_1f0.Relative.field_2._M_local_buf[0] = local_248._M_local_buf[0];
  paVar2 = &local_1f0.Expression.field_2;
  local_1f0.Relative._M_string_length = local_250;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  if (local_230 == &local_220) {
    local_1f0.Expression.field_2._8_8_ = local_220._8_8_;
    local_1f0.Expression._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1f0.Expression._M_dataplus._M_p = (pointer)local_230;
  }
  local_1f0.Expression.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
  local_1f0.Expression.field_2._M_local_buf[0] = local_220._M_local_buf[0];
  local_1f0.Expression._M_string_length = local_228;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_258 = &local_248;
  local_230 = &local_220;
  local_1f0.Recurse = recurse;
  local_1f0.ListDirectories = listDirectories;
  local_1f0.FollowSymlinks = followSymlinks;
  pmVar6 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&local_238->Cache,&local_1f0);
  if (pmVar6->Initialized == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar6->Files,files);
    pmVar6->Initialized = true;
LAB_003363b0:
    std::
    vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
    ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
              ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
                *)&pmVar6->Backtraces,variable,backtrace);
  }
  else {
    __first1 = (pmVar6->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (pmVar6->Files).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if ((long)__last1 - (long)__first1 ==
        (long)(files->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
      bVar5 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (__first1,__last1,__first2);
      if (bVar5) goto LAB_003363b0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The glob expression\n",0x14);
    CacheEntryKey::PrintGlobCommand(&local_1f0,(ostream *)local_1a8,variable);
    cmListFileBacktrace::PrintTitle(backtrace,(ostream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\nwas already present in the glob cache but the directory\ncontents have changed during the configuration run.\n"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Matching glob expressions:",0x1a);
    ppVar7 = (pmVar6->Backtraces).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (pmVar6->Backtraces).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 != ppVar4) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ppVar7->first)._M_dataplus._M_p,
                   (ppVar7->first)._M_string_length);
        cmListFileBacktrace::PrintTitle(&ppVar7->second,(ostream *)local_1a8);
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != ppVar4);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.Expression._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.Expression._M_dataplus._M_p,
                    local_1f0.Expression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.Relative._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.Relative._M_dataplus._M_p,
                    local_1f0.Relative.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const bool recurse, const bool listDirectories, const bool followSymlinks,
  const std::string& relative, const std::string& expression,
  const std::vector<std::string>& files, const std::string& variable,
  const cmListFileBacktrace& backtrace)
{
  CacheEntryKey key = CacheEntryKey(recurse, listDirectories, followSymlinks,
                                    relative, expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n";
    key.PrintGlobCommand(message, variable);
    backtrace.PrintTitle(message);
    message << "\nwas already present in the glob cache but the directory\n"
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      std::get<1>(bt).PrintTitle(message);
    }
    cmSystemTools::Error(message.str());
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}